

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O0

Vector3f operator*(Matrix3f *m,Vector3f *v)

{
  float fVar1;
  float *pfVar2;
  Vector3f *in_RDX;
  float fVar3;
  ulong extraout_XMM0_Qa;
  float fVar5;
  Vector3f VVar6;
  undefined4 local_28;
  undefined4 local_24;
  int j;
  int i;
  Vector3f *v_local;
  Matrix3f *m_local;
  Vector3f *output;
  ulong uVar4;
  
  fVar5 = 0.0;
  Vector3f::Vector3f((Vector3f *)m,0.0,0.0,0.0);
  uVar4 = extraout_XMM0_Qa;
  for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
      pfVar2 = Matrix3f::operator()((Matrix3f *)v,local_24,local_28);
      fVar3 = *pfVar2;
      pfVar2 = Vector3f::operator[](in_RDX,local_28);
      fVar1 = *pfVar2;
      pfVar2 = Vector3f::operator[]((Vector3f *)m,local_24);
      fVar5 = *pfVar2;
      fVar3 = fVar3 * fVar1 + fVar5;
      uVar4 = (ulong)(uint)fVar3;
      *pfVar2 = fVar3;
    }
  }
  VVar6.m_elements[2] = fVar5;
  VVar6.m_elements[0] = (float)(int)uVar4;
  VVar6.m_elements[1] = (float)(int)(uVar4 >> 0x20);
  return (Vector3f)VVar6.m_elements;
}

Assistant:

Vector3f operator * ( const Matrix3f& m, const Vector3f& v )
{
	Vector3f output( 0, 0, 0 );

	for( int i = 0; i < 3; ++i )
	{
		for( int j = 0; j < 3; ++j )
		{
			output[ i ] += m( i, j ) * v[ j ];
		}
	}

	return output;
}